

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ma.c
# Opt level: O1

Boolean MA_set_hard_fail(Boolean value)

{
  Boolean BVar1;
  
  ma_stats.calls[0x1a] = ma_stats.calls[0x1a] + 1;
  BVar1 = ma_hard_fail;
  ma_hard_fail = value;
  return BVar1;
}

Assistant:

public Boolean MA_set_hard_fail( Boolean value /* to set flag to */)
{
    Boolean    old_value;    /* of flag */

#ifdef STATS
    ma_stats.calls[(int)FID_MA_set_hard_fail]++;
#endif /* STATS */

    old_value = ma_hard_fail;
    ma_hard_fail = value;
    return old_value;
}